

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

ParsedSchema __thiscall
capnp::SchemaParser::parseDiskFile
          (SchemaParser *this,StringPtr displayName,StringPtr diskPath,
          ArrayPtr<const_kj::StringPtr> importPath)

{
  map<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
  *this_00;
  MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *this_01;
  undefined1 *puVar1;
  undefined8 *puVar2;
  Impl *pIVar3;
  PathPtr prefix;
  String *pSVar4;
  size_t sVar5;
  char *pcVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator iVar10;
  Clock *clock;
  StringPtr *extraout_RDX;
  StringPtr *params;
  _Base_ptr p_Var11;
  size_t sVar12;
  ArrayPtr<const_char> *this_02;
  long lVar13;
  void *__arg;
  void *pvVar14;
  anon_union_120_1_a8c68091_for_NullableValue<capnp::SchemaParser::DiskFileCompat>_2 *paVar15;
  _Base_ptr *pp_Var16;
  _Base_ptr p_Var17;
  mapped_type *displayNameOverride;
  ReadableDirectory **ppRVar18;
  Own<kj::Directory> OVar19;
  pair<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_bool>
  pVar20;
  ParsedSchema PVar21;
  ArrayPtr<const_kj::ReadableDirectory_*const> importPath_00;
  Path parsed;
  String result_1;
  StringPtr importDir;
  Fault f;
  Array<const_kj::ReadableDirectory_*> result;
  Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> lock;
  StringPtr pathRef;
  PathPtr cwd;
  pair<const_kj::StringPtr_*,_unsigned_long> importPathKey;
  Path local_208;
  mapped_type *local_1e8;
  anon_union_120_1_a8c68091_for_NullableValue<capnp::SchemaParser::DiskFileCompat>_2 *local_1e0;
  Path local_1d8;
  Path *local_1b8;
  _Base_ptr local_1b0;
  pair<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir> local_1a8;
  ImportDir local_158;
  Fault local_118;
  Exception *local_110;
  void **local_108;
  ArrayDisposer *local_100;
  size_t local_f0;
  _Base_ptr local_e8;
  _Base_ptr p_Stack_e0;
  FsNode *pFStack_d8;
  Exception *local_c8;
  size_t local_c0;
  ArrayDisposer *local_b8;
  ReadableDirectory **local_b0;
  char *local_a8;
  SchemaParser *local_a0;
  Mutex *local_98;
  Maybe<capnp::SchemaParser::DiskFileCompat> *local_90;
  char local_88;
  _Base_ptr local_80;
  _Base_ptr p_Stack_78;
  FsNode *pFStack_70;
  _Base_ptr local_68;
  _Base_ptr p_Stack_60;
  PathPtr local_50;
  key_type local_40;
  
  __arg = (void *)diskPath.content.size_;
  local_f0 = displayName.content.size_;
  local_a8 = displayName.content.ptr;
  pIVar3 = (this->impl).ptr;
  this_01 = &pIVar3->compat;
  local_a0 = this;
  kj::_::Mutex::lock(&this_01->mutex,EXCLUSIVE);
  local_90 = &(pIVar3->compat).value;
  paVar15 = &(pIVar3->compat).value.ptr.field_1;
  local_98 = &this_01->mutex;
  if ((pIVar3->compat).value.ptr.isSet == false) {
    kj::newDiskFilesystem();
    (pIVar3->compat).value.ptr.field_1.value.fs = (pIVar3->compat).value.ptr.field_1.value.ownFs.ptr
    ;
    puVar1 = (undefined1 *)((long)&(pIVar3->compat).value.ptr.field_1 + 0x20);
    *(undefined4 *)((long)&(pIVar3->compat).value.ptr.field_1 + 0x20) = 0;
    *(undefined8 *)((long)&(pIVar3->compat).value.ptr.field_1 + 0x28) = 0;
    *(undefined1 **)((long)&(pIVar3->compat).value.ptr.field_1 + 0x30) = puVar1;
    *(undefined1 **)((long)&(pIVar3->compat).value.ptr.field_1 + 0x38) = puVar1;
    *(undefined8 *)((long)&(pIVar3->compat).value.ptr.field_1 + 0x40) = 0;
    puVar1 = (undefined1 *)((long)&(pIVar3->compat).value.ptr.field_1 + 0x50);
    *(undefined4 *)((long)&(pIVar3->compat).value.ptr.field_1 + 0x50) = 0;
    *(undefined8 *)((long)&(pIVar3->compat).value.ptr.field_1 + 0x58) = 0;
    *(undefined1 **)((long)&(pIVar3->compat).value.ptr.field_1 + 0x60) = puVar1;
    *(undefined1 **)((long)&(pIVar3->compat).value.ptr.field_1 + 0x68) = puVar1;
    *(undefined8 *)((long)&(pIVar3->compat).value.ptr.field_1 + 0x70) = 0;
    (pIVar3->compat).value.ptr.isSet = true;
  }
  iVar9 = (**((pIVar3->compat).value.ptr.field_1.value.fs)->_vptr_Filesystem)();
  local_1b8 = (Path *)CONCAT44(extraout_var,iVar9);
  iVar9 = (*((pIVar3->compat).value.ptr.field_1.value.fs)->_vptr_Filesystem[2])();
  local_50.parts.ptr = (String *)CONCAT44(extraout_var_00,iVar9);
  kj::PathPtr::eval(&local_208,&local_50,diskPath);
  if (importPath.size_ == 0) {
    sVar12 = local_f0;
    displayNameOverride = (mapped_type *)(Maybe<kj::String> *)0x0;
    ppRVar18 = (ReadableDirectory **)0x0;
  }
  else {
    local_40.first = importPath.ptr;
    local_40.second = importPath.size_;
    local_1e8 = std::
                map<std::pair<const_kj::StringPtr_*,_unsigned_long>,_kj::Array<const_kj::ReadableDirectory_*>,_std::less<std::pair<const_kj::StringPtr_*,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<const_kj::StringPtr_*,_unsigned_long>,_kj::Array<const_kj::ReadableDirectory_*>_>_>_>
                ::operator[](&(pIVar3->compat).value.ptr.field_1.value.cachedImportPaths,&local_40);
    if (local_1e8->size_ == 0) {
      __arg = (void *)0x0;
      local_1e0 = paVar15;
      local_118.exception =
           (Exception *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,0,importPath.size_,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_108 = (local_118.exception)->trace + (importPath.size_ - 10);
      local_100 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      local_110 = local_118.exception;
      if (importPath.size_ != 0) {
        this_00 = &(local_1e0->value).cachedImportDirs;
        p_Var17 = (_Base_ptr)((long)local_1e0 + 0x20);
        this_02 = &(importPath.ptr)->content;
        local_1b0 = p_Var17;
        do {
          iVar10 = std::
                   _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                   ::find(&this_00->_M_t,(key_type *)this_02);
          if (iVar10._M_node == p_Var17) {
            kj::PathPtr::eval(&local_1d8,&local_50,(StringPtr)*this_02);
            (*(code *)(local_1b8->parts).ptr[3].content.disposer)
                      (&local_1a8,local_1b8,local_1d8.parts.ptr,local_1d8.parts.size_);
            params = extraout_RDX;
            if ((_Base_ptr)local_1a8.first.content.size_ == (_Base_ptr)0x0) {
              clock = kj::nullClock();
              OVar19 = kj::newInMemoryDirectory((kj *)&local_1a8,clock);
              params = (StringPtr *)OVar19.ptr;
            }
            p_Var11 = (_Base_ptr)local_1a8.first.content.size_;
            pcVar6 = local_1a8.first.content.ptr;
            local_68 = (_Base_ptr)this_02->ptr;
            p_Stack_60 = (_Base_ptr)this_02->size_;
            kj::str<kj::StringPtr_const&>(&local_158.pathStr,(kj *)this_02,params);
            local_1a8.second.path.parts.size_ = local_1d8.parts.size_;
            local_1a8.second.path.parts.ptr = local_1d8.parts.ptr;
            local_158.path.parts.disposer = local_1d8.parts.disposer;
            local_1d8.parts.ptr = (String *)0x0;
            local_1d8.parts.size_ = 0;
            local_158.dir.disposer = (Disposer *)pcVar6;
            local_1a8.first.content.ptr = (char *)local_68;
            local_1a8.first.content.size_ = (size_t)p_Stack_60;
            local_1a8.second.pathStr.content.ptr = local_158.pathStr.content.ptr;
            local_1a8.second.pathStr.content.size_ = local_158.pathStr.content.size_;
            local_1a8.second.pathStr.content.disposer = local_158.pathStr.content.disposer;
            local_158.pathStr.content.ptr = (char *)0x0;
            local_158.pathStr.content.size_ = 0;
            local_1a8.second.path.parts.disposer = local_1d8.parts.disposer;
            local_158.path.parts.ptr = (String *)0x0;
            local_158.path.parts.size_ = 0;
            local_1a8.second.dir.disposer = (Disposer *)pcVar6;
            local_1a8.second.dir.ptr = (ReadableDirectory *)p_Var11;
            local_158.dir.ptr = (ReadableDirectory *)0x0;
            pVar20 = std::
                     _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
                     ::
                     _M_emplace_unique<std::pair<kj::StringPtr,capnp::SchemaParser::DiskFileCompat::ImportDir>>
                               ((_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
                                 *)this_00,&local_1a8);
            DiskFileCompat::ImportDir::~ImportDir(&local_1a8.second);
            DiskFileCompat::ImportDir::~ImportDir(&local_158);
            pvVar14 = (void *)local_1d8.parts.size_;
            pSVar4 = local_1d8.parts.ptr;
            if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              local_158.pathStr.content.ptr = (char *)0x0;
              local_1a8.first.content.ptr = (char *)0x0;
              local_1a8.first.content.size_ = 0;
              kj::_::Debug::Fault::init
                        ((Fault *)&local_158,
                         (EVP_PKEY_CTX *)
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser.c++"
                        );
              kj::_::Debug::Fault::fatal((Fault *)&local_158);
            }
            p_Var17 = local_1b0;
            if (local_1d8.parts.ptr != (String *)0x0) {
              local_1d8.parts.ptr = (String *)0x0;
              local_1d8.parts.size_ = 0;
              (**(local_1d8.parts.disposer)->_vptr_ArrayDisposer)
                        (local_1d8.parts.disposer,pSVar4,0x18,pvVar14,pvVar14,
                         kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
              __arg = pvVar14;
              p_Var17 = local_1b0;
            }
          }
          else {
            p_Var11 = iVar10._M_node[3]._M_parent;
          }
          (local_110->ownFile).content.ptr = (char *)p_Var11;
          local_110 = (Exception *)&(local_110->ownFile).content.size_;
          this_02 = this_02 + 1;
        } while (this_02 != &importPath.ptr[importPath.size_].content);
      }
      local_c0 = (long)local_110 - (long)local_118.exception >> 3;
      local_c8 = local_118.exception;
      local_b8 = local_100;
      ppRVar18 = local_1e8->ptr;
      if (ppRVar18 != (ReadableDirectory **)0x0) {
        __arg = (void *)local_1e8->size_;
        local_1e8->ptr = (ReadableDirectory **)0x0;
        local_1e8->size_ = 0;
        (**local_1e8->disposer->_vptr_ArrayDisposer)(local_1e8->disposer,ppRVar18,8,__arg,__arg,0);
      }
      local_1e8->ptr = (ReadableDirectory **)local_c8;
      local_1e8->size_ = local_c0;
      local_1e8->disposer = local_b8;
      paVar15 = local_1e0;
    }
    local_b0 = local_1e8->ptr;
    local_1e8 = (mapped_type *)local_1e8->size_;
    if (importPath.size_ == 0) {
      pp_Var16 = (_Base_ptr *)0x0;
    }
    else {
      local_1b0 = (_Base_ptr)importPath.ptr;
      local_1e0 = (anon_union_120_1_a8c68091_for_NullableValue<capnp::SchemaParser::DiskFileCompat>_2
                   *)&(paVar15->value).cachedImportDirs;
      lVar13 = 0;
      p_Var11 = (_Base_ptr)0x0;
      pp_Var16 = (_Base_ptr *)0x0;
      do {
        puVar2 = (undefined8 *)((long)&local_1b0->_M_color + lVar13);
        local_158.pathStr.content.ptr = (char *)*puVar2;
        local_158.pathStr.content.size_ = puVar2[1];
        iVar10 = std::
                 _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                 ::find((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                         *)&local_1e0->value,(key_type *)&local_158);
        if (iVar10._M_node == (_Base_ptr)((long)paVar15 + 0x20)) {
          local_118.exception = (Exception *)0x0;
          local_1a8.first.content.ptr = (char *)0x0;
          local_1a8.first.content.size_ = 0;
          kj::_::Debug::Fault::init
                    (&local_118,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_118);
        }
        prefix.parts.ptr = (String *)iVar10._M_node[2]._M_parent;
        prefix.parts.size_ = (size_t)iVar10._M_node[2]._M_left;
        local_1a8.first.content.ptr = (char *)local_208.parts.ptr;
        local_1a8.first.content.size_ = local_208.parts.size_;
        bVar8 = kj::PathPtr::startsWith((PathPtr *)&local_1a8,prefix);
        if (bVar8) {
          if (p_Var11 < iVar10._M_node[2]._M_left) {
            p_Var11 = iVar10._M_node[2]._M_left;
            pp_Var16 = &iVar10._M_node[1]._M_left;
          }
        }
        lVar13 = lVar13 + 0x10;
      } while (importPath.size_ << 4 != lVar13);
    }
    sVar12 = local_f0;
    displayNameOverride = local_1e8;
    ppRVar18 = local_b0;
    if (pp_Var16 != (_Base_ptr *)0x0) {
      local_1b8 = (Path *)pp_Var16[7];
      local_158.pathStr.content.ptr =
           (char *)((FsNode *)&(local_208.parts.ptr)->content + (long)pp_Var16[4] * 3);
      local_158.pathStr.content.size_ = local_208.parts.size_ - (long)pp_Var16[4];
      kj::PathPtr::clone((PathPtr *)&local_1a8,(__fn *)&local_158,local_158.pathStr.content.ptr,
                         (int)local_158.pathStr.content.size_,__arg);
      sVar5 = local_208.parts.size_;
      pSVar4 = local_208.parts.ptr;
      if ((_Base_ptr)local_208.parts.ptr != (_Base_ptr)0x0) {
        local_208.parts.ptr = (String *)0x0;
        local_208.parts.size_ = 0;
        (**(local_208.parts.disposer)->_vptr_ArrayDisposer)
                  (local_208.parts.disposer,pSVar4,0x18,sVar5,sVar5,
                   kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
      }
      local_208.parts.ptr = (String *)local_1a8.first.content.ptr;
      local_208.parts.size_ = local_1a8.first.content.size_;
      local_208.parts.disposer = (ArrayDisposer *)local_1a8.second.pathStr.content.ptr;
      displayNameOverride = local_1e8;
      ppRVar18 = local_b0;
    }
  }
  local_e8 = (_Base_ptr)local_208.parts.ptr;
  p_Stack_e0 = (_Base_ptr)local_208.parts.size_;
  pFStack_d8 = (FsNode *)local_208.parts.disposer;
  local_208.parts.ptr = (String *)0x0;
  local_208.parts.size_ = 0;
  sVar12 = sVar12 - 1;
  kj::heapString((String *)&local_1a8,sVar12);
  if (sVar12 != 0) {
    p_Var11 = (_Base_ptr)local_1a8.first.content.size_;
    if ((_Base_ptr)local_1a8.first.content.size_ != (_Base_ptr)0x0) {
      p_Var11 = (_Base_ptr)local_1a8.first.content.ptr;
    }
    memcpy(p_Var11,local_a8,sVar12);
  }
  local_88 = '\x01';
  local_80 = (_Base_ptr)local_1a8.first.content.ptr;
  p_Stack_78 = (_Base_ptr)local_1a8.first.content.size_;
  pFStack_70 = (FsNode *)local_1a8.second.pathStr.content.ptr;
  local_1a8.first.content.ptr = (char *)0x0;
  local_1a8.first.content.size_ = 0;
  importPath_00.size_ = (size_t)ppRVar18;
  importPath_00.ptr = (ReadableDirectory **)&local_e8;
  SchemaFile::newFromDirectory
            ((ReadableDirectory *)&local_158,local_1b8,importPath_00,
             (Maybe<kj::String> *)displayNameOverride);
  PVar21 = parseFile(local_a0,(Own<capnp::SchemaFile> *)&local_158);
  sVar12 = local_158.pathStr.content.size_;
  if ((long *)local_158.pathStr.content.size_ != (long *)0x0) {
    local_158.pathStr.content.size_ = 0;
    (***(_func_int ***)local_158.pathStr.content.ptr)
              (local_158.pathStr.content.ptr,sVar12 + *(long *)(*(long *)sVar12 + -0x10));
  }
  p_Var7 = p_Stack_78;
  p_Var11 = local_80;
  if ((local_88 == '\x01') && (local_80 != (_Base_ptr)0x0)) {
    local_80 = (_Base_ptr)0x0;
    p_Stack_78 = (_Base_ptr)0x0;
    (**pFStack_70->_vptr_FsNode)(pFStack_70,p_Var11,1,p_Var7,p_Var7,0);
  }
  sVar12 = local_1a8.first.content.size_;
  pcVar6 = local_1a8.first.content.ptr;
  if (local_1a8.first.content.ptr != (char *)0x0) {
    local_1a8.first.content.ptr = (char *)0x0;
    local_1a8.first.content.size_ = 0;
    (***(_func_int ***)local_1a8.second.pathStr.content.ptr)
              (local_1a8.second.pathStr.content.ptr,pcVar6,1,sVar12,sVar12,0);
  }
  p_Var7 = p_Stack_e0;
  p_Var11 = local_e8;
  if (local_e8 != (_Base_ptr)0x0) {
    local_e8 = (_Base_ptr)0x0;
    p_Stack_e0 = (_Base_ptr)0x0;
    (**pFStack_d8->_vptr_FsNode)
              (pFStack_d8,p_Var11,0x18,p_Var7,p_Var7,
               kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  sVar12 = local_208.parts.size_;
  pSVar4 = local_208.parts.ptr;
  if (local_208.parts.ptr != (String *)0x0) {
    local_208.parts.ptr = (String *)0x0;
    local_208.parts.size_ = 0;
    (**(local_208.parts.disposer)->_vptr_ArrayDisposer)
              (local_208.parts.disposer,pSVar4,0x18,sVar12,sVar12,
               kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  if (local_98 != (Mutex *)0x0) {
    kj::_::Mutex::unlock(local_98,EXCLUSIVE);
  }
  return PVar21;
}

Assistant:

ParsedSchema SchemaParser::parseDiskFile(
    kj::StringPtr displayName, kj::StringPtr diskPath,
    kj::ArrayPtr<const kj::StringPtr> importPath) const {
  auto lock = impl->compat.lockExclusive();
  DiskFileCompat* compat;
  KJ_IF_MAYBE(c, *lock) {
    compat = c;
  } else {
    compat = &lock->emplace();
  }